

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

lyd_node *
resolve_partial_json_data_nodeid
          (char *nodeid,char *llist_value,lyd_node *start,int options,int *parsed)

{
  char cVar1;
  LYS_NODE LVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  lys_node *plVar7;
  uint8_t *puVar8;
  char *pcVar9;
  lys_module *plVar10;
  lys_module *plVar11;
  ushort **ppuVar12;
  undefined4 extraout_var_00;
  LY_ERR *pLVar13;
  ulong uVar14;
  lyd_node *plVar15;
  char *pcVar16;
  LY_ECODE code;
  char *pcVar17;
  lyd_node *plVar18;
  size_t sVar19;
  lyd_node *node;
  char *local_f0;
  char *pred_name;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  char *value;
  int local_b8;
  uint local_b4;
  int pred_name_len;
  char *llist_value_local;
  char *name;
  lyd_node *local_98;
  char *local_90;
  char *name_1;
  char *mod_name;
  char *local_78;
  int local_6c;
  int local_68;
  int val_len;
  int nam_len;
  int llval_len;
  int last_has_pred;
  int local_54;
  int local_50;
  int local_4c;
  int nam_len_1;
  int local_44;
  int is_relative;
  int mod_name_len;
  int has_predicate;
  
  local_b4 = options;
  _pred_name_len = llist_value;
  value = ly_buf();
  nam_len_1 = -1;
  if (((nodeid == (char *)0x0) || (start == (lyd_node *)0x0)) || (parsed == (int *)0x0)) {
    __assert_fail("nodeid && start && parsed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x8f8,
                  "struct lyd_node *resolve_partial_json_data_nodeid(const char *, const char *, struct lyd_node *, int, int *)"
                 );
  }
  pred_name = (char *)start->schema->module->ctx;
  uVar3 = parse_schema_nodeid(nodeid,&name_1,&local_44,&llist_value_local,&local_68,&nam_len_1,
                              &is_relative);
  mod_name = (char *)CONCAT44(extraout_var,uVar3);
  if (0 < (int)uVar3) {
    _has_predicate = parsed;
    if (nam_len_1 == 0) {
      do {
        plVar15 = start;
        start = plVar15->parent;
      } while (plVar15->parent != (lyd_node *)0x0);
      name = (char *)lyd_node_module(plVar15);
    }
    else {
      name = (char *)lyd_node_module(start);
      plVar15 = start->child;
    }
    pcVar17 = nodeid + uVar3;
    local_98 = (lyd_node *)0x0;
    local_e0 = nodeid;
LAB_00114f71:
    llval_len = 0;
    node = plVar15;
    do {
      if (node == (lyd_node *)0x0) {
        return local_98;
      }
      plVar7 = lys_parent(node->schema);
      if (plVar7 != (lys_node *)0x0) {
        plVar7 = lys_parent(node->schema);
        if ((local_b4 & 4) == 0) {
          if (plVar7->nodetype == LYS_OUTPUT) {
            pLVar13 = ly_errno_location();
            *pLVar13 = LY_EINVAL;
            pcVar17 = node->schema->name;
            pcVar16 = "Provided data tree includes some RPC output nodes (%s).";
LAB_0011555b:
            ly_log(LY_LLERR,pcVar16,pcVar17);
            parsed = _has_predicate;
            goto LAB_00115568;
          }
        }
        else if (plVar7->nodetype == LYS_INPUT) {
          pLVar13 = ly_errno_location();
          *pLVar13 = LY_EINVAL;
          pcVar17 = node->schema->name;
          pcVar16 = "Provided data tree includes some RPC input nodes (%s).";
          goto LAB_0011555b;
        }
      }
      pcVar16 = node->schema->name;
      sVar19 = (size_t)local_68;
      iVar4 = strncmp(llist_value_local,pcVar16,sVar19);
      if ((iVar4 == 0) && (pcVar16[sVar19] == '\0')) {
        plVar10 = (lys_module *)name;
        if (name_1 != (char *)0x0) {
          if (0x3ff < local_44) {
            pLVar13 = ly_errno_location();
            *pLVar13 = LY_EINT;
            ly_log(LY_LLERR,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                   ,0x929);
            parsed = _has_predicate;
            goto LAB_00115568;
          }
          puVar8 = ly_buf_used_location();
          pcVar16 = value;
          if (*puVar8 == '\0') {
            pcVar9 = (char *)0x0;
          }
          else if (*value == '\0') {
            pcVar9 = (char *)0x0;
          }
          else {
            pcVar9 = strndup(value,0x3ff);
          }
          puVar8 = ly_buf_used_location();
          *puVar8 = *puVar8 + '\x01';
          sVar19 = (size_t)local_44;
          memmove(pcVar16,name_1,sVar19);
          pcVar16[sVar19] = '\0';
          plVar10 = ly_ctx_get_module((ly_ctx *)pred_name,pcVar16,(char *)0x0);
          if (pcVar9 != (char *)0x0) {
            strncpy(pcVar16,pcVar9,0x3ff);
            free(pcVar9);
          }
          puVar8 = ly_buf_used_location();
          *puVar8 = *puVar8 + 0xff;
          if (plVar10 == (lys_module *)0x0) {
            pcVar17 = strndup(local_e0,(size_t)(name_1 + ((long)local_44 - (long)local_e0)));
            ly_vlog(LYE_PATH_INMOD,LY_VLOG_STR,pcVar17);
            free(pcVar17);
            parsed = _has_predicate;
            goto LAB_00115568;
          }
        }
        plVar11 = lyd_node_module(node);
        iVar4 = llval_len;
        pcVar16 = llist_value_local;
        if (plVar10 == plVar11) {
          LVar2 = node->schema->nodetype;
          if (LVar2 == LYS_LIST) {
            if (is_relative == 0) {
              return local_98;
            }
            local_4c = 1;
            local_78 = pcVar17;
            mod_name_len = parse_schema_json_predicate
                                     (pcVar17,&local_90,&local_50,&local_c8,&local_6c,&local_4c);
            iVar6 = local_50;
            pcVar9 = local_90;
            if ((mod_name_len < 1) || (iVar5 = strncmp(local_90,".",(long)local_50), iVar5 == 0)) {
              pcVar17 = local_78 + -(long)mod_name_len;
              cVar1 = *pcVar17;
              goto LAB_0011560d;
            }
            iVar4 = iVar4 + 1;
            ppuVar12 = __ctype_b_loc();
            llval_len = iVar4;
            if ((*(byte *)((long)*ppuVar12 + (long)*pcVar9 * 2 + 1) & 8) == 0) {
              if (node->schema->padding[2] == '\0') {
                mod_name_len = 0;
LAB_0011547a:
                pcVar17 = local_78 + mod_name_len;
                iVar4 = mod_name_len + (int)mod_name;
                goto LAB_0011548a;
              }
              local_d0 = pcVar16;
              plVar15 = node->child;
              pcVar17 = local_78;
              if (plVar15 != (lyd_node *)0x0) {
                last_has_pred = 0;
                local_54 = 0;
                do {
                  pcVar16 = plVar15->schema->name;
                  local_d8 = pcVar17;
                  iVar4 = strncmp(pcVar16,pcVar9,(long)iVar6);
                  if ((iVar4 != 0) || (pcVar16[iVar6] != '\0')) {
                    code = LYE_PATH_INKEY;
LAB_00115624:
                    ly_vlog(code,LY_VLOG_NONE,(void *)0x0,pcVar9);
                    parsed = _has_predicate;
                    goto LAB_00115568;
                  }
                  if ((plVar15[1].validity & 7) == 0) {
LAB_00115291:
                    plVar18 = plVar15->child;
                  }
                  else {
                    plVar18 = plVar15->child;
                    plVar10 = lyd_node_module(node);
                    pcVar17 = plVar10->name;
                    plVar10 = lyd_node_module(node);
                    sVar19 = strlen(plVar10->name);
                    iVar4 = strncmp((char *)plVar18,pcVar17,sVar19);
                    if (iVar4 != 0) goto LAB_00115291;
                    plVar18 = plVar15->child;
                    plVar10 = lyd_node_module(node);
                    sVar19 = strlen(plVar10->name);
                    if (*(char *)((long)&plVar18->schema + sVar19) != ':') goto LAB_00115291;
                    plVar18 = plVar15->child;
                    plVar10 = lyd_node_module(node);
                    sVar19 = strlen(plVar10->name);
                    plVar18 = (lyd_node *)((long)&plVar18->schema + sVar19 + 1);
                  }
                  sVar19 = (size_t)local_6c;
                  iVar4 = strncmp((char *)plVar18,local_c8,sVar19);
                  pcVar17 = local_78;
                  if ((iVar4 != 0) || (*(char *)((long)&plVar18->schema + sVar19) != '\0')) break;
                  iVar4 = last_has_pred + mod_name_len;
                  if ((ushort)node->schema->padding[2] <= (ushort)(local_54 + 1)) {
                    mod_name_len = iVar4;
                    if (local_4c != 0) {
                      code = LYE_PATH_INKEY;
                      pcVar9 = local_90;
                      goto LAB_00115624;
                    }
                    goto LAB_0011547a;
                  }
                  if (local_4c == 0) {
                    code = LYE_PATH_MISSKEY;
                    pcVar9 = local_d0;
                    goto LAB_00115624;
                  }
                  pcVar17 = local_d8 + (uint)mod_name_len;
                  plVar15 = plVar15->next;
                  last_has_pred = iVar4;
                  local_54 = local_54 + 1;
                  mod_name_len = parse_schema_json_predicate
                                           (pcVar17,&local_90,&local_50,&local_c8,&local_6c,
                                            &local_4c);
                  iVar6 = local_50;
                  pcVar9 = local_90;
                  if ((mod_name_len < 1) ||
                     (iVar4 = strncmp(local_90,".",(long)local_50), iVar4 == 0)) {
                    pcVar17 = pcVar17 + -(long)mod_name_len;
                    uVar14 = (ulong)(uint)(int)*pcVar17;
                    goto LAB_0011564a;
                  }
                } while( true );
              }
            }
            else {
              iVar6 = atoi(pcVar9);
              pcVar17 = local_78;
              if (iVar6 == iVar4) goto LAB_0011547a;
            }
          }
          else {
            if (LVar2 != LYS_LEAFLIST) {
              iVar4 = (int)mod_name;
              goto LAB_0011548a;
            }
            nam_len = 0;
            if (is_relative == 0) {
              uVar14 = 0;
              if (_pred_name_len != (char *)0x0) {
                sVar19 = strlen(_pred_name_len);
                val_len = (int)sVar19;
              }
            }
            else {
              uVar3 = parse_schema_json_predicate
                                (pcVar17,&local_f0,&local_b8,(char **)&pred_name_len,&val_len,
                                 &nam_len);
              if ((int)uVar3 < 1) {
                uVar14 = (ulong)(uint)(int)*pcVar17;
                goto LAB_0011564a;
              }
              uVar14 = (ulong)uVar3;
              if ((*local_f0 != '.') || (local_b8 != 1)) {
                uVar14 = (ulong)(uint)(int)pcVar17[1];
                pcVar17 = pcVar17 + 1;
                goto LAB_0011564a;
              }
            }
            if ((node[1].validity & 7) == 0) {
LAB_001153fa:
              plVar15 = node->child;
            }
            else {
              plVar15 = node->child;
              plVar10 = lyd_node_module(node);
              pcVar16 = plVar10->name;
              plVar10 = lyd_node_module(node);
              sVar19 = strlen(plVar10->name);
              iVar4 = strncmp((char *)plVar15,pcVar16,sVar19);
              if (iVar4 != 0) goto LAB_001153fa;
              plVar15 = node->child;
              plVar10 = lyd_node_module(node);
              sVar19 = strlen(plVar10->name);
              if (*(char *)((long)&plVar15->schema + sVar19) != ':') goto LAB_001153fa;
              plVar15 = node->child;
              plVar10 = lyd_node_module(node);
              sVar19 = strlen(plVar10->name);
              plVar15 = (lyd_node *)((long)&plVar15->schema + sVar19 + 1);
            }
            if ((_pred_name_len == (char *)0x0) && (plVar15 != (lyd_node *)0x0)) {
              cVar1 = *(char *)&plVar15->schema;
            }
            else {
              if (_pred_name_len == (char *)0x0) goto LAB_0011544c;
              sVar19 = (size_t)val_len;
              iVar4 = strncmp(_pred_name_len,(char *)plVar15,sVar19);
              if (iVar4 != 0) goto LAB_001150af;
              cVar1 = *(char *)((long)&plVar15->schema + sVar19);
            }
            if (cVar1 == '\0') goto LAB_0011544c;
          }
        }
      }
LAB_001150af:
      node = node->next;
    } while( true );
  }
  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,(ulong)(uint)(int)nodeid[-uVar3],nodeid + -uVar3)
  ;
LAB_00115568:
  *parsed = -1;
  return (lyd_node *)0x0;
LAB_0011544c:
  pcVar17 = pcVar17 + uVar14;
  iVar4 = (int)mod_name + (int)uVar14;
  is_relative = nam_len;
LAB_0011548a:
  *_has_predicate = *_has_predicate + iVar4;
  uVar14 = (ulong)(uint)(int)*pcVar17;
  if ((int)*pcVar17 == 0) {
    return node;
  }
  if ((node->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
  goto LAB_0011564a;
  name = (char *)lyd_node_module(node);
  plVar15 = node->child;
  uVar3 = parse_schema_nodeid(pcVar17,&name_1,&local_44,&llist_value_local,&local_68,&nam_len_1,
                              &is_relative);
  if ((int)uVar3 < 1) goto LAB_0011565e;
  pcVar17 = pcVar17 + uVar3;
  local_98 = node;
  mod_name = (char *)CONCAT44(extraout_var_00,uVar3);
  goto LAB_00114f71;
LAB_0011565e:
  cVar1 = pcVar17[-uVar3];
  pcVar17 = pcVar17 + -uVar3;
LAB_0011560d:
  uVar14 = (ulong)(uint)(int)cVar1;
LAB_0011564a:
  ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar14,pcVar17);
  parsed = _has_predicate;
  goto LAB_00115568;
}

Assistant:

struct lyd_node *
resolve_partial_json_data_nodeid(const char *nodeid, const char *llist_value, struct lyd_node *start, int options,
                                 int *parsed)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *id, *mod_name, *name, *pred_name, *data_val;
    int r, ret, mod_name_len, nam_len, is_relative = -1, list_instance_position;
    int has_predicate, last_parsed, llval_len, pred_name_len, last_has_pred;
    struct lyd_node *sibling, *last_match = NULL;
    struct lyd_node_leaf_list *llist;
    const struct lys_module *prefix_mod, *prev_mod;
    struct ly_ctx *ctx;

    assert(nodeid && start && parsed);

    ctx = start->schema->module->ctx;
    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        *parsed = -1;
        return NULL;
    }
    id += r;
    /* add it to parsed only after the data node was actually found */
    last_parsed = r;

    if (is_relative) {
        prev_mod = lyd_node_module(start);
        start = start->child;
    } else {
        for (; start->parent; start = start->parent);
        prev_mod = lyd_node_module(start);
    }

    while (1) {
        list_instance_position = 0;

        LY_TREE_FOR(start, sibling) {
            /* RPC/action data check, return simply invalid argument, because the data tree is invalid */
            if (lys_parent(sibling->schema)) {
                if (options & LYD_PATH_OPT_OUTPUT) {
                    if (lys_parent(sibling->schema)->nodetype == LYS_INPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC input nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    if (lys_parent(sibling->schema)->nodetype == LYS_OUTPUT) {
                        LOGERR(LY_EINVAL, "Provided data tree includes some RPC output nodes (%s).", sibling->schema->name);
                        *parsed = -1;
                        return NULL;
                    }
                }
            }

            /* name match */
            if (!strncmp(name, sibling->schema->name, nam_len) && !sibling->schema->name[nam_len]) {

                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        *parsed = -1;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        *parsed = -1;
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lyd_node_module(sibling)) {
                    continue;
                }

                /* leaf-list, did we find it with the correct value or not? */
                if (sibling->schema->nodetype == LYS_LEAFLIST) {
                    llist = (struct lyd_node_leaf_list *)sibling;

                    last_has_pred = 0;
                    if (has_predicate) {
                        if ((r = parse_schema_json_predicate(id, &pred_name, &pred_name_len, &llist_value, &llval_len, &last_has_pred)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                            *parsed = -1;
                            return NULL;
                        }
                        if ((pred_name[0] != '.') || (pred_name_len != 1)) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[1], id + 1);
                            *parsed = -1;
                            return NULL;
                        }
                    } else {
                        r = 0;
                        if (llist_value) {
                            llval_len = strlen(llist_value);
                        }
                    }

                    /* make value canonical */
                    if ((llist->value_type & LY_TYPE_IDENT)
                            && !strncmp(llist->value_str, lyd_node_module(sibling)->name, strlen(lyd_node_module(sibling)->name))
                            && (llist->value_str[strlen(lyd_node_module(sibling)->name)] == ':')) {
                        data_val = llist->value_str + strlen(lyd_node_module(sibling)->name) + 1;
                    } else {
                        data_val = llist->value_str;
                    }

                    if ((!llist_value && data_val && data_val[0])
                            || (llist_value && (strncmp(llist_value, data_val, llval_len) || data_val[llval_len]))) {
                        continue;
                    }

                    id += r;
                    last_parsed += r;
                    has_predicate = last_has_pred;

                } else if (sibling->schema->nodetype == LYS_LIST) {
                    /* list, we likely need predicates'n'stuff then, but if without a predicate, we are always creating it */
                    if (!has_predicate) {
                        /* none match */
                        return last_match;
                    }

                    ++list_instance_position;
                    r = 0;
                    ret = resolve_partial_json_data_list_predicate(id, name, sibling, list_instance_position, &r);
                    if (ret == -1) {
                        *parsed = -1;
                        return NULL;
                    } else if (ret == 1) {
                        /* this list instance does not match */
                        continue;
                    }
                    id += r;
                    last_parsed += r;
                }

                *parsed += last_parsed;

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    *parsed = -1;
                    return NULL;
                }
                last_match = sibling;
                prev_mod = lyd_node_module(sibling);
                start = sibling->child;
                break;
            }
        }

        /* no match, return last match */
        if (!sibling) {
            return last_match;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            *parsed = -1;
            return NULL;
        }
        id += r;
        last_parsed = r;
    }

    /* cannot get here */
    LOGINT;
    *parsed = -1;
    return NULL;
}